

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O1

void chacha20_block(uint32_t *initial_state,uchar *keystream)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98 [19];
  uint local_4c;
  uint32_t *local_48;
  uchar *local_40;
  long local_38;
  
  local_98[4] = (uint)*(undefined8 *)(initial_state + 4);
  local_98[5] = (uint)((ulong)*(undefined8 *)(initial_state + 4) >> 0x20);
  local_98[0] = (uint)*(undefined8 *)initial_state;
  local_a0 = local_98[0];
  local_98[1] = (uint)((ulong)*(undefined8 *)initial_state >> 0x20);
  local_9c = local_98[1];
  local_98[0xc] = (uint)*(undefined8 *)(initial_state + 0xc);
  local_98[0xd] = (uint)((ulong)*(undefined8 *)(initial_state + 0xc) >> 0x20);
  local_98[8] = (uint)*(undefined8 *)(initial_state + 8);
  local_98[9] = (uint)((ulong)*(undefined8 *)(initial_state + 8) >> 0x20);
  local_98[6] = (uint)*(undefined8 *)(initial_state + 6);
  local_98[2] = (uint)*(undefined8 *)(initial_state + 2);
  local_a4 = local_98[2];
  local_98[0xe] = (uint)*(undefined8 *)(initial_state + 0xe);
  local_98[10] = (uint)*(undefined8 *)(initial_state + 10);
  local_98[7] = (uint)((ulong)*(undefined8 *)(initial_state + 6) >> 0x20);
  local_98[3] = (uint)((ulong)*(undefined8 *)(initial_state + 2) >> 0x20);
  local_a8 = local_98[3];
  local_98[0xf] = (uint)((ulong)*(undefined8 *)(initial_state + 0xe) >> 0x20);
  local_98[0xb] = (uint)((ulong)*(undefined8 *)(initial_state + 10) >> 0x20);
  lVar1 = 10;
  do {
    local_38 = lVar1;
    local_98[0xc] = local_98[0xc] ^ local_a0 + local_98[4];
    uVar2 = local_98[0xc] << 0x10 | local_98[0xc] >> 0x10;
    local_98[8] = local_98[8] + uVar2;
    uVar4 = local_98[4] ^ local_98[8];
    uVar5 = uVar4 << 0xc | uVar4 >> 0x14;
    local_a0 = local_a0 + local_98[4] + uVar5;
    uVar2 = uVar2 ^ local_a0;
    uVar4 = uVar2 << 8 | uVar2 >> 0x18;
    local_98[8] = local_98[8] + uVar4;
    uVar5 = uVar5 ^ local_98[8];
    uVar6 = uVar5 << 7 | uVar5 >> 0x19;
    local_98[0xd] = local_98[0xd] ^ local_9c + local_98[5];
    uVar5 = local_98[0xd] << 0x10 | local_98[0xd] >> 0x10;
    local_98[9] = local_98[9] + uVar5;
    uVar2 = local_98[5] ^ local_98[9];
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    local_9c = local_9c + local_98[5] + uVar2;
    uVar5 = uVar5 ^ local_9c;
    uVar3 = uVar5 << 8 | uVar5 >> 0x18;
    local_4c = local_98[9] + uVar3;
    uVar2 = uVar2 ^ local_4c;
    uVar5 = uVar2 << 7 | uVar2 >> 0x19;
    local_98[0xe] = local_98[0xe] ^ local_a4 + local_98[6];
    uVar8 = local_98[0xe] << 0x10 | local_98[0xe] >> 0x10;
    local_98[10] = local_98[10] + uVar8;
    uVar2 = local_98[6] ^ local_98[10];
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    local_a4 = local_a4 + local_98[6] + uVar2;
    uVar8 = uVar8 ^ local_a4;
    uVar9 = uVar8 << 8 | uVar8 >> 0x18;
    local_98[10] = local_98[10] + uVar9;
    uVar2 = uVar2 ^ local_98[10];
    uVar2 = uVar2 << 7 | uVar2 >> 0x19;
    local_98[0xf] = local_98[0xf] ^ local_a8 + local_98[7];
    uVar7 = local_98[0xf] << 0x10 | local_98[0xf] >> 0x10;
    local_98[0xb] = local_98[0xb] + uVar7;
    uVar8 = local_98[7] ^ local_98[0xb];
    uVar8 = uVar8 << 0xc | uVar8 >> 0x14;
    local_a8 = local_a8 + local_98[7] + uVar8;
    uVar7 = uVar7 ^ local_a8;
    uVar7 = uVar7 << 8 | uVar7 >> 0x18;
    local_98[0xb] = local_98[0xb] + uVar7;
    uVar8 = uVar8 ^ local_98[0xb];
    uVar8 = uVar8 << 7 | uVar8 >> 0x19;
    local_a0 = local_a0 + uVar5;
    uVar7 = uVar7 ^ local_a0;
    uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
    local_98[10] = local_98[10] + uVar7;
    uVar5 = uVar5 ^ local_98[10];
    uVar5 = uVar5 << 0xc | uVar5 >> 0x14;
    local_a0 = local_a0 + uVar5;
    uVar7 = uVar7 ^ local_a0;
    local_98[0xf] = uVar7 << 8 | uVar7 >> 0x18;
    local_98[10] = local_98[10] + local_98[0xf];
    uVar5 = uVar5 ^ local_98[10];
    local_98[5] = uVar5 << 7 | uVar5 >> 0x19;
    local_9c = local_9c + uVar2;
    uVar4 = uVar4 ^ local_9c;
    uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
    local_98[0xb] = local_98[0xb] + uVar4;
    uVar2 = uVar2 ^ local_98[0xb];
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    local_9c = local_9c + uVar2;
    uVar4 = uVar4 ^ local_9c;
    local_98[0xc] = uVar4 << 8 | uVar4 >> 0x18;
    local_98[0xb] = local_98[0xb] + local_98[0xc];
    uVar2 = uVar2 ^ local_98[0xb];
    local_98[6] = uVar2 << 7 | uVar2 >> 0x19;
    local_a4 = local_a4 + uVar8;
    uVar3 = uVar3 ^ local_a4;
    uVar2 = uVar3 << 0x10 | uVar3 >> 0x10;
    local_98[8] = local_98[8] + uVar2;
    uVar8 = uVar8 ^ local_98[8];
    uVar4 = uVar8 << 0xc | uVar8 >> 0x14;
    local_a4 = local_a4 + uVar4;
    uVar2 = uVar2 ^ local_a4;
    local_98[0xd] = uVar2 << 8 | uVar2 >> 0x18;
    local_98[8] = local_98[8] + local_98[0xd];
    uVar4 = uVar4 ^ local_98[8];
    local_98[7] = uVar4 << 7 | uVar4 >> 0x19;
    local_a8 = local_a8 + uVar6;
    uVar9 = uVar9 ^ local_a8;
    uVar4 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_98[9] = local_4c + uVar4;
    uVar6 = uVar6 ^ local_98[9];
    uVar2 = uVar6 << 0xc | uVar6 >> 0x14;
    local_a8 = local_a8 + uVar2;
    uVar4 = uVar4 ^ local_a8;
    local_98[0xe] = uVar4 << 8 | uVar4 >> 0x18;
    local_98[9] = local_98[9] + local_98[0xe];
    uVar2 = uVar2 ^ local_98[9];
    local_98[4] = uVar2 << 7 | uVar2 >> 0x19;
    lVar1 = local_38 + -1;
  } while (local_38 + -1 != 0);
  local_98[1] = local_9c + initial_state[1];
  local_98[0] = local_a0 + *initial_state;
  local_98[3] = local_a8 + initial_state[3];
  local_98[2] = local_a4 + initial_state[2];
  local_98[5] = local_98[5] + initial_state[5];
  local_98[4] = local_98[4] + initial_state[4];
  local_98[7] = local_98[7] + initial_state[7];
  local_98[6] = local_98[6] + initial_state[6];
  local_98[9] = local_98[9] + initial_state[9];
  local_98[8] = local_98[8] + initial_state[8];
  local_98[0xb] = local_98[0xb] + initial_state[0xb];
  local_98[10] = local_98[10] + initial_state[10];
  local_98[0xd] = local_98[0xd] + initial_state[0xd];
  local_98[0xc] = local_98[0xc] + initial_state[0xc];
  local_98[0xf] = local_98[0xf] + initial_state[0xf];
  local_98[0xe] = local_98[0xe] + initial_state[0xe];
  lVar1 = 0;
  do {
    *(uint *)(keystream + lVar1 * 4) = local_98[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  local_48 = initial_state;
  local_40 = keystream;
  mbedtls_platform_zeroize(local_98,0x40);
  return;
}

Assistant:

static void chacha20_block( const uint32_t initial_state[16],
                            unsigned char keystream[64] )
{
    uint32_t working_state[16];
    size_t i;

    memcpy( working_state,
            initial_state,
            CHACHA20_BLOCK_SIZE_BYTES );

    for( i = 0U; i < 10U; i++ )
        chacha20_inner_block( working_state );

    working_state[ 0] += initial_state[ 0];
    working_state[ 1] += initial_state[ 1];
    working_state[ 2] += initial_state[ 2];
    working_state[ 3] += initial_state[ 3];
    working_state[ 4] += initial_state[ 4];
    working_state[ 5] += initial_state[ 5];
    working_state[ 6] += initial_state[ 6];
    working_state[ 7] += initial_state[ 7];
    working_state[ 8] += initial_state[ 8];
    working_state[ 9] += initial_state[ 9];
    working_state[10] += initial_state[10];
    working_state[11] += initial_state[11];
    working_state[12] += initial_state[12];
    working_state[13] += initial_state[13];
    working_state[14] += initial_state[14];
    working_state[15] += initial_state[15];

    for( i = 0U; i < 16; i++ )
    {
        size_t offset = i * 4U;

        keystream[offset     ] = (unsigned char)( working_state[i]       );
        keystream[offset + 1U] = (unsigned char)( working_state[i] >>  8 );
        keystream[offset + 2U] = (unsigned char)( working_state[i] >> 16 );
        keystream[offset + 3U] = (unsigned char)( working_state[i] >> 24 );
    }

    mbedtls_platform_zeroize( working_state, sizeof( working_state ) );
}